

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O0

void __thiscall foxxll::ufs_file_base::_set_size(ufs_file_base *this,offset_type newsize)

{
  int iVar1;
  offset_type oVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  io_error *piVar6;
  __off64_t _Var7;
  string local_368;
  ostringstream local_348 [8];
  ostringstream msg_1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream msg;
  offset_type cur_size;
  offset_type newsize_local;
  ufs_file_base *this_local;
  
  oVar2 = _size(this);
  if ((((this->mode_ & 1U) == 0) && ((this->is_device_ & 1U) == 0)) &&
     (iVar1 = ftruncate64(this->file_des_,newsize), iVar1 != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar3 = std::operator<<((ostream *)local_198,"Error in ");
    poVar3 = std::operator<<(poVar3,"void foxxll::ufs_file_base::_set_size(offset_type)");
    poVar3 = std::operator<<(poVar3," : ");
    poVar3 = std::operator<<(poVar3,"ftruncate() path=");
    poVar3 = std::operator<<(poVar3,(string *)&this->filename_);
    poVar3 = std::operator<<(poVar3," fd=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->file_des_);
    poVar3 = std::operator<<(poVar3," : ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar5);
    piVar6 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    io_error::io_error(piVar6,&local_1c8);
    __cxa_throw(piVar6,&io_error::typeinfo,io_error::~io_error);
  }
  if ((oVar2 < newsize) && (_Var7 = lseek64(this->file_des_,newsize - 1,0), _Var7 < 0)) {
    std::__cxx11::ostringstream::ostringstream(local_348);
    poVar3 = std::operator<<((ostream *)local_348,"Error in ");
    poVar3 = std::operator<<(poVar3,"void foxxll::ufs_file_base::_set_size(offset_type)");
    poVar3 = std::operator<<(poVar3," : ");
    poVar3 = std::operator<<(poVar3,"lseek() path=");
    poVar3 = std::operator<<(poVar3,(string *)&this->filename_);
    poVar3 = std::operator<<(poVar3," fd=");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->file_des_);
    poVar3 = std::operator<<(poVar3," pos=");
    std::ostream::operator<<(poVar3,newsize - 1);
    piVar6 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    io_error::io_error(piVar6,&local_368);
    __cxa_throw(piVar6,&io_error::typeinfo,io_error::~io_error);
  }
  return;
}

Assistant:

void ufs_file_base::_set_size(offset_type newsize)
{
    offset_type cur_size = _size();

    if (!(mode_ & RDONLY) && !is_device_)
    {
#if FOXXLL_WINDOWS || defined(__MINGW32__)
        HANDLE hfile = (HANDLE)::_get_osfhandle(file_des_);
        FOXXLL_THROW_ERRNO_NE_0(
            (hfile == INVALID_HANDLE_VALUE), io_error,
            "_get_osfhandle() path=" << filename_ << " fd=" << file_des_
        );

        LARGE_INTEGER desired_pos;
        desired_pos.QuadPart = newsize;

        if (!SetFilePointerEx(hfile, desired_pos, nullptr, FILE_BEGIN))
            FOXXLL_THROW_WIN_LASTERROR(
                io_error,
                "SetFilePointerEx in ufs_file_base::set_size(..) oldsize=" << cur_size <<
                    " newsize=" << newsize << " "
            );

        if (!SetEndOfFile(hfile))
            FOXXLL_THROW_WIN_LASTERROR(
                io_error,
                "SetEndOfFile oldsize=" << cur_size <<
                    " newsize=" << newsize << " "
            );
#else
        FOXXLL_THROW_ERRNO_NE_0(
            ::ftruncate(file_des_, newsize), io_error,
            "ftruncate() path=" << filename_ << " fd=" << file_des_
        );
#endif
    }

#if !FOXXLL_WINDOWS
    if (newsize > cur_size)
        FOXXLL_THROW_IF(
            ::lseek(file_des_, newsize - 1, SEEK_SET) < 0, io_error,
            "lseek() path=" << filename_ << " fd=" << file_des_ << " pos=" << newsize - 1
        );
#endif
}